

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O0

void EMIT_REG_KILL(CodeGenGenericContext *ctx,x86XmmReg reg)

{
  x86XmmReg reg_local;
  CodeGenGenericContext *ctx_local;
  
  EMIT_OP_REG(ctx,o_kill_register,reg);
  return;
}

Assistant:

void EMIT_REG_KILL(CodeGenGenericContext &ctx, x86XmmReg reg)
{
#ifdef NULLC_OPTIMIZE_X86
	EMIT_OP_REG(ctx, o_kill_register, reg);
#else
	(void)ctx;
	(void)reg;
#endif
}